

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O2

CollationCacheEntry *
icu_63::CollationLoader::makeCacheEntry
          (Locale *loc,CollationCacheEntry *entryFromCache,UErrorCode *errorCode)

{
  UBool UVar1;
  CollationCacheEntry *this;
  Locale *other;
  
  this = entryFromCache;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    other = &entryFromCache->validLocale;
    UVar1 = Locale::operator==(loc,other);
    if (UVar1 == '\0') {
      this = (CollationCacheEntry *)UMemory::operator_new((UMemory *)0x100,(size_t)other);
      if (this == (CollationCacheEntry *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        this = (CollationCacheEntry *)0x0;
      }
      else {
        CollationCacheEntry::CollationCacheEntry(this,loc,entryFromCache->tailoring);
        SharedObject::addRef((SharedObject *)this);
      }
      SharedObject::removeRef(&entryFromCache->super_SharedObject);
    }
  }
  return this;
}

Assistant:

const CollationCacheEntry *
CollationLoader::makeCacheEntry(
        const Locale &loc,
        const CollationCacheEntry *entryFromCache,
        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode) || loc == entryFromCache->validLocale) {
        return entryFromCache;
    }
    CollationCacheEntry *entry = new CollationCacheEntry(loc, entryFromCache->tailoring);
    if(entry == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        entryFromCache->removeRef();
        return NULL;
    }
    entry->addRef();
    entryFromCache->removeRef();
    return entry;
}